

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O0

int create_iso_image(uchar *buff,size_t buffsize,size_t *used,char *opt)

{
  long in_RCX;
  char sym255 [256];
  char sym128 [129];
  char sym1 [2];
  char fname2 [256];
  char fname1 [256];
  int lens [33];
  int fcnt;
  int l;
  int i;
  archive *a;
  char *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  wchar_t in_stack_fffffffffffffbb8;
  wchar_t in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  wchar_t in_stack_fffffffffffffbc4;
  archive *in_stack_fffffffffffffbc8;
  archive *in_stack_fffffffffffffbd8;
  void *in_stack_fffffffffffffbe0;
  undefined1 local_348 [127];
  undefined1 local_2c9;
  undefined1 local_2c8;
  undefined1 local_2ba;
  undefined1 local_2b9;
  undefined1 local_2b8 [256];
  undefined1 local_1b8 [256];
  int local_b8 [33];
  int local_34;
  int local_30;
  int local_2c;
  archive *local_28;
  long local_20;
  
  local_20 = in_RCX;
  memcpy(local_b8,&DAT_002e85d0,0x84);
  local_28 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  archive_write_set_format_iso9660(in_stack_fffffffffffffbd8);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  archive_write_add_filter_none(local_28);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  archive_write_set_option
            ((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             in_stack_fffffffffffffba8);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  if (local_20 != 0) {
    archive_write_set_options
              ((archive *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               in_stack_fffffffffffffba8);
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                     (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffba8);
  }
  archive_write_set_bytes_per_block
            ((archive *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb4);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  archive_write_set_bytes_in_last_block
            ((archive *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb4);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  archive_write_open_memory
            (in_stack_fffffffffffffbc8,
             (void *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (size_t *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_2ba = 0x78;
  local_2b9 = 0;
  for (local_2c = 0; local_2c < 0x7f; local_2c = local_2c + 1) {
    local_348[local_2c] = 0x61;
  }
  local_2c9 = 0x78;
  local_2c8 = 0;
  for (local_2c = 0; local_2c < 0xfe; local_2c = local_2c + 1) {
    (&stack0xfffffffffffffbb8)[local_2c] = 0x61;
  }
  local_34 = 0;
  for (local_2c = 0; -1 < local_b8[local_2c]; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < local_b8[local_2c]; local_30 = local_30 + 1) {
      local_1b8[local_30] = 0x61;
      local_2b8[local_30] = 0x41;
    }
    if (0 < local_30) {
      local_1b8[local_30] = 0;
      local_2b8[local_30] = 0;
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_34 = local_34 + 2;
    }
    if (local_30 < 0xfe) {
      local_1b8[local_30] = 0x2e;
      local_1b8[local_30 + 1] = 99;
      local_1b8[local_30 + 2] = 0;
      local_2b8[local_30] = 0x2e;
      local_2b8[local_30 + 1] = 0x43;
      local_2b8[local_30 + 2] = 0;
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_34 = local_34 + 2;
    }
    if (local_30 < 0xfc) {
      local_1b8[local_30] = 0x2e;
      local_1b8[local_30 + 1] = 0x70;
      local_1b8[local_30 + 2] = 0x6e;
      local_1b8[local_30 + 3] = 0x67;
      local_1b8[local_30 + 4] = 0;
      local_2b8[local_30] = 0x2e;
      local_2b8[local_30 + 1] = 0x50;
      local_2b8[local_30 + 2] = 0x4e;
      local_2b8[local_30 + 3] = 0x47;
      local_2b8[local_30 + 4] = 0;
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_34 = local_34 + 2;
    }
    if (local_30 < 0xfb) {
      local_1b8[local_30] = 0x2e;
      local_1b8[local_30 + 1] = 0x6a;
      local_1b8[local_30 + 2] = 0x70;
      local_1b8[local_30 + 3] = 0x65;
      local_1b8[local_30 + 4] = 0x67;
      local_1b8[local_30 + 5] = 0;
      local_2b8[local_30] = 0x2e;
      local_2b8[local_30 + 1] = 0x4a;
      local_2b8[local_30 + 2] = 0x50;
      local_2b8[local_30 + 3] = 0x45;
      local_2b8[local_30 + 4] = 0x47;
      local_2b8[local_30 + 5] = 0;
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      add_entry((archive *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_34 = local_34 + 2;
    }
  }
  archive_write_close((archive *)0x1fc130);
  assertion_equal_int((char *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4,
                      CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                      (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      (longlong)local_28,(char *)0x1fc162,in_stack_fffffffffffffbe0);
  archive_write_free((archive *)0x1fc16f);
  assertion_equal_int((char *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4,
                      CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                      (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      (longlong)local_28,(char *)0x1fc1a1,in_stack_fffffffffffffbe0);
  return local_34;
}

Assistant:

static int
create_iso_image(unsigned char *buff, size_t buffsize, size_t *used,
    const char *opt)
{
	struct archive *a;
	int i, l, fcnt;
	const int lens[] = {
	    0, 1, 3, 5, 7, 8, 9, 29, 30, 31, 32,
		62, 63, 64, 65, 101, 102, 103, 104,
	    191, 192, 193, 194, 204, 205, 206, 207, 208,
		252, 253, 254, 255,
	    -1 };
	char fname1[256];
	char fname2[256];
	char sym1[2];
	char sym128[129];
	char sym255[256];

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_iso9660(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_option(a, NULL, "pad", NULL));
	if (opt)
		assertA(0 == archive_write_set_options(a, opt));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, used));

	sym1[0] = 'x';
	sym1[1] = '\0';
	for (i = 0; i < (int)sizeof(sym128)-2; i++)
		sym128[i] = 'a';
	sym128[sizeof(sym128)-2] = 'x';
	sym128[sizeof(sym128)-1] = '\0';
	for (i = 0; i < (int)sizeof(sym255)-2; i++)
		sym255[i] = 'a';
	sym255[sizeof(sym255)-2] = 'x';
	sym255[sizeof(sym255)-1] = '\0';

	fcnt = 0;
	for (i = 0; lens[i] >= 0; i++) {
		for (l = 0; l < lens[i]; l++) {
			fname1[l] = 'a';
			fname2[l] = 'A';
		}
		if (l > 0) {
			fname1[l] = '\0';
			fname2[l] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 254) {
			fname1[l] = '.';
			fname1[l+1] = 'c';
			fname1[l+2] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'C';
			fname2[l+2] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
		if (l < 252) {
			fname1[l] = '.';
			fname1[l+1] = 'p';
			fname1[l+2] = 'n';
			fname1[l+3] = 'g';
			fname1[l+4] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'P';
			fname2[l+2] = 'N';
			fname2[l+3] = 'G';
			fname2[l+4] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 251) {
			fname1[l] = '.';
			fname1[l+1] = 'j';
			fname1[l+2] = 'p';
			fname1[l+3] = 'e';
			fname1[l+4] = 'g';
			fname1[l+5] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'J';
			fname2[l+2] = 'P';
			fname2[l+3] = 'E';
			fname2[l+4] = 'G';
			fname2[l+5] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
	}

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	return (fcnt);
}